

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O0

char * toLocalFormat(char *name)

{
  char cVar1;
  char *ptr_00;
  int local_28;
  int j;
  int p;
  char *ptr;
  char *result;
  char *name_local;
  
  ptr_00 = (char *)malloc(0x100);
  checkMalloc(ptr_00);
  _j = ptr_00;
  result = name;
  while (*result != '\0') {
    cVar1 = *result;
    for (local_28 = 0; result = result + 1, local_28 < cVar1; local_28 = local_28 + 1) {
      *_j = *result;
      _j = _j + 1;
    }
    *_j = '.';
    _j = _j + 1;
  }
  _j[-1] = '\0';
  return ptr_00;
}

Assistant:

char *toLocalFormat(char *name)
{

    char *result = (char *) malloc(256);
    checkMalloc(result);
    char *ptr = result;
    while (*name)
    {
        int p = *name++;
        for (int j = 0; j < (int) p; ++j)
        {

            *ptr++ = *name++;
        }
        *ptr++ = '.';
    }
    *--ptr = '\0';
    return result;
}